

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O1

void __thiscall adios2::transport::FileStdio::Truncate(FileStdio *this,size_t length)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  size_t sVar5;
  long *plVar6;
  size_type *psVar7;
  char cVar8;
  string __str;
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  char *local_90;
  uint local_88;
  char local_80 [16];
  string local_70;
  string local_50;
  
  WaitForOpen(this);
  iVar3 = fileno((FILE *)this->m_File);
  iVar3 = ftruncate(iVar3,length);
  if (iVar3 == -1) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Toolkit","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"transport::file::FileStdio","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Truncate","");
    cVar8 = '\x01';
    if (9 < length) {
      sVar5 = length;
      cVar2 = '\x04';
      do {
        cVar8 = cVar2;
        if (sVar5 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_006457c4;
        }
        if (sVar5 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_006457c4;
        }
        if (sVar5 < 10000) goto LAB_006457c4;
        bVar1 = 99999 < sVar5;
        sVar5 = sVar5 / 10000;
        cVar2 = cVar8 + '\x04';
      } while (bVar1);
      cVar8 = cVar8 + '\x01';
    }
LAB_006457c4:
    local_90 = local_80;
    std::__cxx11::string::_M_construct((ulong)&local_90,cVar8);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_90,local_88,length);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x75d040);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_e0 = *plVar6;
      lStack_d8 = plVar4[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar6;
      local_f0 = (long *)*plVar4;
    }
    local_e8 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_c0 = *plVar6;
      lStack_b8 = plVar4[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar6;
      local_d0 = (long *)*plVar4;
    }
    local_c8 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,
                                (ulong)(this->super_Transport).m_Name._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_b0.field_2._M_allocated_capacity = *psVar7;
      local_b0.field_2._8_8_ = plVar4[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar7;
      local_b0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_b0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_50,&local_70,&local_110,&local_b0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void FileStdio::Truncate(const size_t length)
{

    WaitForOpen();
    int fd = fileno(m_File);
    const auto status = ftruncate(fd, length);
    if (status == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Truncate",
                                              "couldn't truncate to " + std::to_string(length) +
                                                  " of file " + m_Name);
    }
}